

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O3

uint64_t sx_tm_round_to_common_refresh_rate(uint64_t duration)

{
  uint64_t uVar1;
  int i;
  bool bVar2;
  
  i = 0;
  do {
    uVar1 = _stm_refresh_rates[(uint)i][0];
    if (uVar1 == 0) {
      return duration;
    }
    bVar2 = _stm_refresh_rates[(uint)i][1] + uVar1 <= duration ||
            duration <= uVar1 - _stm_refresh_rates[(uint)i][1];
    i = i + (uint)bVar2;
  } while (bVar2);
  return uVar1;
}

Assistant:

uint64_t sx_tm_round_to_common_refresh_rate(uint64_t duration)
{
    return stm_round_to_common_refresh_rate(duration);
}